

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O2

void __thiscall FGameConfigFile::AddAutoexec(FGameConfigFile *this,DArgs *list,char *game)

{
  bool bVar1;
  int iVar2;
  FString expanded_path;
  char *value;
  DArgs *local_90;
  FString local_88;
  char *key;
  char section [64];
  
  local_90 = list;
  mysnprintf(section,0x40,"%s.AutoExec",game);
  CreateStandardAutoExec(this,section,false);
  bVar1 = FConfigFile::SectionIsEmpty(&this->super_FConfigFile);
  if (!bVar1) {
    while( true ) {
      bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&key,&value);
      if (!bVar1) break;
      iVar2 = strcasecmp(key,"Path");
      if ((iVar2 == 0) && (*value != '\0')) {
        ExpandEnvVars((char *)&expanded_path);
        bVar1 = FileExists(expanded_path.Chars);
        if (bVar1) {
          ExpandEnvVars((char *)&local_88);
          DArgs::AppendArg(local_90,&local_88);
          FString::~FString(&local_88);
        }
        FString::~FString(&expanded_path);
      }
    }
  }
  return;
}

Assistant:

void FGameConfigFile::AddAutoexec (DArgs *list, const char *game)
{
	char section[64];
	const char *key;
	const char *value;

	mysnprintf (section, countof(section), "%s.AutoExec", game);

	// If <game>.AutoExec section does not exist, create it
	// with a default autoexec.cfg file present.
	CreateStandardAutoExec(section, false);
	// Run any files listed in the <game>.AutoExec section
	if (!SectionIsEmpty())
	{
		while (NextInSection (key, value))
		{
			if (stricmp (key, "Path") == 0 && *value != '\0')
			{
				FString expanded_path = ExpandEnvVars(value);
				if (FileExists(expanded_path))
				{
					list->AppendArg (ExpandEnvVars(value));
				}
			}
		}
	}
}